

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fxch.c
# Opt level: O0

int Fxch_FastExtract(Vec_Wec_t *vCubes,int ObjIdMax,int nMaxDivExt,int fVerbose,int fVeryVerbose)

{
  bool bVar1;
  int iDiv_00;
  Fxch_Man_t *pFxchMan_00;
  abctime aVar2;
  abctime aVar3;
  float fVar4;
  int local_34;
  int iDiv;
  int i;
  Fxch_Man_t *pFxchMan;
  abctime TempTime;
  int fVeryVerbose_local;
  int fVerbose_local;
  int nMaxDivExt_local;
  int ObjIdMax_local;
  Vec_Wec_t *vCubes_local;
  
  pFxchMan_00 = Fxch_ManAlloc(vCubes);
  aVar2 = Abc_Clock();
  Fxch_CubesGruping(pFxchMan_00);
  Fxch_ManMapLiteralsIntoCubes(pFxchMan_00,ObjIdMax);
  Fxch_ManGenerateLitHashKeys(pFxchMan_00);
  Fxch_ManComputeLevel(pFxchMan_00);
  Fxch_ManSCHashTablesInit(pFxchMan_00);
  Fxch_ManDivCreate(pFxchMan_00);
  aVar3 = Abc_Clock();
  pFxchMan_00->timeInit = aVar3 - aVar2;
  if (fVeryVerbose != 0) {
    Fxch_ManPrintDivs(pFxchMan_00);
  }
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan_00);
  }
  aVar2 = Abc_Clock();
  local_34 = 0;
  while( true ) {
    if ((nMaxDivExt == 0) || (bVar1 = false, local_34 < nMaxDivExt)) {
      fVar4 = Vec_QueTopPriority(pFxchMan_00->vDivPrio);
      bVar1 = 0.0 < fVar4;
    }
    if (!bVar1) break;
    iDiv_00 = Vec_QuePop(pFxchMan_00->vDivPrio);
    if (fVeryVerbose != 0) {
      Fxch_DivPrint(pFxchMan_00,iDiv_00);
    }
    Fxch_ManUpdate(pFxchMan_00,iDiv_00);
    local_34 = local_34 + 1;
  }
  aVar3 = Abc_Clock();
  pFxchMan_00->timeExt = aVar3 - aVar2;
  if (fVerbose != 0) {
    Fxch_ManPrintStats(pFxchMan_00);
    Abc_PrintTime(1,"\n[FXCH] Elapsed Time",pFxchMan_00->timeInit + pFxchMan_00->timeExt);
    Abc_PrintTime(1,"[FXCH]    +-> Init",pFxchMan_00->timeInit);
    Abc_PrintTime(1,"[FXCH]    +-> Extr",pFxchMan_00->timeExt);
  }
  Fxch_CubesUnGruping(pFxchMan_00);
  Fxch_ManSCHashTablesFree(pFxchMan_00);
  Fxch_ManFree(pFxchMan_00);
  Vec_WecRemoveEmpty(vCubes);
  Vec_WecSortByFirstInt(vCubes,0);
  return 1;
}

Assistant:

int Fxch_FastExtract( Vec_Wec_t* vCubes,
                      int ObjIdMax,
                      int nMaxDivExt,
                      int fVerbose,
                      int fVeryVerbose )
{
    abctime TempTime;
    Fxch_Man_t* pFxchMan = Fxch_ManAlloc( vCubes );
    int i;

    TempTime = Abc_Clock();
    Fxch_CubesGruping( pFxchMan );
    Fxch_ManMapLiteralsIntoCubes( pFxchMan, ObjIdMax );
    Fxch_ManGenerateLitHashKeys( pFxchMan );
    Fxch_ManComputeLevel( pFxchMan );
    Fxch_ManSCHashTablesInit( pFxchMan );
    Fxch_ManDivCreate( pFxchMan );
    pFxchMan->timeInit = Abc_Clock() - TempTime;

    if ( fVeryVerbose )
        Fxch_ManPrintDivs( pFxchMan );

    if ( fVerbose )
        Fxch_ManPrintStats( pFxchMan );

    TempTime = Abc_Clock();
    
    for ( i = 0; (!nMaxDivExt || i < nMaxDivExt) && Vec_QueTopPriority( pFxchMan->vDivPrio ) > 0.0; i++ )
    {
        int iDiv = Vec_QuePop( pFxchMan->vDivPrio );

        if ( fVeryVerbose )
            Fxch_DivPrint( pFxchMan, iDiv );

        Fxch_ManUpdate( pFxchMan, iDiv );
    }
   
    pFxchMan->timeExt = Abc_Clock() - TempTime;

    if ( fVerbose )
    {
        Fxch_ManPrintStats( pFxchMan );
        Abc_PrintTime( 1, "\n[FXCH] Elapsed Time", pFxchMan->timeInit + pFxchMan->timeExt );
        Abc_PrintTime( 1, "[FXCH]    +-> Init", pFxchMan->timeInit );
        Abc_PrintTime( 1, "[FXCH]    +-> Extr", pFxchMan->timeExt );
    }

    Fxch_CubesUnGruping( pFxchMan );
    Fxch_ManSCHashTablesFree( pFxchMan );
    Fxch_ManFree( pFxchMan );

    Vec_WecRemoveEmpty( vCubes );
    Vec_WecSortByFirstInt( vCubes, 0 );

    return 1;
}